

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O0

bool __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::operator==
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *other)

{
  integer_iterator<unsigned_long> *this_00;
  undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  *this_01;
  Edge_handle edge_handle;
  Edge_handle edge_handle_00;
  type_conflict1 tVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference u;
  Vertex_handle a;
  Vertex_handle b_00;
  size_t sVar5;
  size_t sVar6;
  reference s;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *b;
  Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>
  __end0_2;
  Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>
  __begin0_2;
  Const_complex_blocker_range *__range3_2;
  undefined1 local_110 [8];
  edge_desc_impl<boost::undirected_tag,_unsigned_long> e;
  Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  __end0_1;
  Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  __begin0_1;
  Complex_edge_range *__range3_1;
  undefined1 local_88 [4];
  Vertex_handle v;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  __end0;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  __begin0;
  Complex_vertex_range *__range3;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *other_local;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this_local;
  
  iVar3 = num_vertices(other);
  iVar4 = num_vertices(this);
  if (iVar3 == iVar4) {
    iVar3 = num_edges(other);
    iVar4 = num_edges(this);
    if (iVar3 == iVar4) {
      sVar5 = num_blockers(other);
      sVar6 = num_blockers(this);
      if (sVar5 == sVar6) {
        vertex_range((Complex_vertex_range *)&__begin0.vertexIterator.second,this);
        this_00 = &__begin0.vertexIterator.second;
        boost::iterator_range_detail::
        iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
        ::begin((Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
                 *)&__end0.vertexIterator.second,
                (iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
                 *)this_00);
        boost::iterator_range_detail::
        iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
        ::end((Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
               *)local_88,
              (iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
               *)this_00);
        while (tVar1 = boost::iterators::operator!=
                                 ((iterator_facade<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long>
                                   *)&__end0.vertexIterator.second,
                                  (iterator_facade<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long>
                                   *)local_88), tVar1) {
          u = boost::iterators::detail::
              iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
              ::operator*((iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                           *)&__end0.vertexIterator.second);
          bVar2 = contains_vertex(other,(Vertex_handle)u.vertex);
          if (!bVar2) {
            return false;
          }
          boost::iterators::detail::
          iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
          ::operator++((iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                        *)&__end0.vertexIterator.second);
        }
        edge_range((Complex_edge_range *)&__begin0_1.edge_iterator.second,this);
        this_01 = &__begin0_1.edge_iterator.second;
        boost::iterator_range_detail::
        iterator_range_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
        ::begin((Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
                 *)&__end0_1.edge_iterator.second,
                (iterator_range_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
                 *)this_01);
        boost::iterator_range_detail::
        iterator_range_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
        ::end((Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
               *)&e.m_eproperty,
              (iterator_range_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
               *)this_01);
        while (tVar1 = boost::iterators::operator!=
                                 ((iterator_facade<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                                   *)&__end0_1.edge_iterator.second,
                                  (iterator_facade<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                                   *)&e.m_eproperty), tVar1) {
          boost::iterators::detail::
          iterator_facade_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
          ::operator*((reference *)local_110,
                      (iterator_facade_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                       *)&__end0_1.edge_iterator.second);
          edge_handle.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
               e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
          edge_handle.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
               (unsigned_long)local_110;
          edge_handle.m_eproperty =
               (property_type *)e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
          a = first_vertex(this,edge_handle);
          edge_handle_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
               e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
          edge_handle_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
               (unsigned_long)local_110;
          edge_handle_00.m_eproperty =
               (property_type *)e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
          b_00 = second_vertex(this,edge_handle_00);
          bVar2 = contains_edge(other,a,b_00);
          if (!bVar2) {
            return false;
          }
          boost::iterators::detail::
          iterator_facade_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
          ::operator++((iterator_facade_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                        *)&__end0_1.edge_iterator.second);
        }
        const_blocker_range((Const_complex_blocker_range *)&__begin0_2.end_of_map,this);
        join_0x00000010_0x00000000_ =
             boost::iterator_range_detail::
             iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
             ::begin((iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
                      *)&__begin0_2.end_of_map);
        _b = boost::iterator_range_detail::
             iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
             ::end((iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
                    *)&__begin0_2.end_of_map);
        while (tVar1 = boost::iterators::operator!=
                                 ((iterator_facade<Gudhi::skeleton_blocker::Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long>
                                   *)&__end0_2.end_of_map,
                                  (iterator_facade<Gudhi::skeleton_blocker::Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long>
                                   *)&b), tVar1) {
          s = boost::iterators::detail::
              iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
              ::operator*((iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
                           *)&__end0_2.end_of_map);
          bVar2 = contains_blocker(other,s);
          if (!bVar2) {
            return false;
          }
          boost::iterators::detail::
          iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
          ::operator++((iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
                        *)&__end0_2.end_of_map);
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const Skeleton_blocker_complex& other) const {
    if (other.num_vertices() != num_vertices()) return false;
    if (other.num_edges() != num_edges()) return false;
    if (other.num_blockers() != num_blockers()) return false;

    for (auto v : vertex_range())
      if (!other.contains_vertex(v)) return false;

    for (auto e : edge_range())
      if (!other.contains_edge(first_vertex(e), second_vertex(e))) return false;

    for (const auto b : const_blocker_range())
      if (!other.contains_blocker(*b)) return false;

    return true;
  }